

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::TextbookBoyerMooreSetup<char16_t>::Init(TextbookBoyerMooreSetup<char16_t> *this)

{
  uint uVar1;
  Char *pCVar2;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  undefined4 *puVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (this->patLen == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xc,"(patLen > 0)","patLen > 0");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  for (lVar7 = 8; lVar7 != 0xc; lVar7 = lVar7 + 1) {
    (this->linearChar + lVar7 * 2 + -0xc)[0] = L'\xffff';
    (this->linearChar + lVar7 * 2 + -0xc)[1] = L'\xffff';
  }
  this->numLinearChars = 1;
  pCVar2 = this->pat;
  uVar1 = this->patLen;
  this->linearChar[0] = pCVar2[uVar1 - 1];
  uVar8 = 1;
  uVar9 = 0;
  do {
    if (uVar1 <= uVar9) break;
    uVar4 = 0;
    do {
      uVar10 = uVar4;
      if (uVar8 == (uint)uVar10) {
        if (uVar8 != 4) {
          this->linearChar[uVar8] = pCVar2[uVar9];
          this->lastOcc[uVar8] = (int32)uVar9;
        }
        uVar8 = uVar8 + 1;
        this->numLinearChars = uVar8;
        goto LAB_00d58a3c;
      }
      uVar4 = (ulong)((uint)uVar10 + 1);
    } while (this->linearChar[uVar10] != pCVar2[uVar9]);
    this->lastOcc[uVar10] = (int32)uVar9;
LAB_00d58a3c:
    uVar9 = uVar9 + 1;
  } while (uVar8 < 5);
  this->scheme = (uint)(uVar8 < 5);
  return;
}

Assistant:

void TextbookBoyerMooreSetup<C>::Init()
    {
        Assert(patLen > 0);
        for (uint i = 0; i < MaxCharMapLinearChars; i++)
        {
            lastOcc[i] = -1;
        }

        numLinearChars = 1;

        // Always put the last character in the first index
        linearChar[0] = pat[patLen - 1];
        for (CharCount i = 0; i < patLen; i++)
        {
            if (numLinearChars <= MaxCharMapLinearChars)
            {
                uint j = 0;
                for (; j < numLinearChars; j++)
                {
                    if (linearChar[j] == pat[i])
                    {
                        lastOcc[j] = i;
                        break;
                    }
                }
                if (j == numLinearChars)
                {
                    if (numLinearChars < MaxCharMapLinearChars)
                    {
                        linearChar[numLinearChars] = pat[i];
                        lastOcc[numLinearChars] = i;
                    }
                    numLinearChars++;
                }
            }

            if (numLinearChars > MaxCharMapLinearChars)
            {
                break;
            }
        }
        if (numLinearChars <= MaxCharMapLinearChars)
        {
            scheme = LinearScheme;
        }
        else
        {
            scheme = DefaultScheme;
        }
    }